

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_TimedText.cpp
# Opt level: O0

h__Writer * __thiscall
AS_02::TimedText::MXFWriter::h__Writer::TimedText_TDesc_to_MD
          (h__Writer *this,TimedTextDescriptor *TDesc)

{
  Rational *in_RDX;
  ulong local_30;
  long local_28;
  TimedTextDescriptor *TDescObj;
  TimedTextDescriptor *TDesc_local;
  h__Writer *this_local;
  
  TDesc_local = TDesc;
  this_local = this;
  if (*(long *)&TDesc[5].NamespaceName != 0) {
    local_28 = *(long *)&TDesc[5].NamespaceName;
    TDescObj = (TimedTextDescriptor *)in_RDX;
    ASDCP::MXF::Rational::operator=((Rational *)(local_28 + 0xe8),in_RDX);
    local_30 = (ulong)*(uint *)(TDescObj + 8);
    ASDCP::MXF::optional_property<unsigned_long_long>::operator=
              ((optional_property<unsigned_long_long> *)(local_28 + 0xf8),&local_30);
    Kumu::Identifier<16U>::Set((Identifier<16U> *)(local_28 + 0x170),(byte_t *)(TDescObj + 0xc));
    ASDCP::MXF::UTF16String::operator=
              ((UTF16String *)(local_28 + 0x1b8),(string *)(TDescObj + 0x20));
    ASDCP::MXF::UTF16String::operator=((UTF16String *)(local_28 + 400),(string *)(TDescObj + 0x40));
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    return this;
  }
  __assert_fail("m_EssenceDescriptor",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
                ,0x1a4,
                "ASDCP::Result_t AS_02::TimedText::MXFWriter::h__Writer::TimedText_TDesc_to_MD(TimedText::TimedTextDescriptor &)"
               );
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::MXFWriter::h__Writer::TimedText_TDesc_to_MD(TimedText::TimedTextDescriptor& TDesc)
{
  assert(m_EssenceDescriptor);
  ASDCP::MXF::TimedTextDescriptor* TDescObj = (ASDCP::MXF::TimedTextDescriptor*)m_EssenceDescriptor;

  TDescObj->SampleRate = TDesc.EditRate;
  TDescObj->ContainerDuration = TDesc.ContainerDuration;
  TDescObj->ResourceID.Set(TDesc.AssetID);
  TDescObj->NamespaceURI = TDesc.NamespaceName;
  TDescObj->UCSEncoding = TDesc.EncodingName;

  return RESULT_OK;
}